

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_qneg_s8_arm(CPUARMState *env,uint32_t x)

{
  anon_union_4_2_9473010e aVar1;
  anon_union_4_2_9473010e conv_u_1;
  anon_union_4_2_9473010e conv_u;
  neon_s8 vec;
  uint32_t x_local;
  CPUARMState *env_local;
  
  conv_u_1.v.v1 = (int8_t)x;
  conv_u_1.i._1_3_ = (undefined3)(x >> 8);
  if (conv_u_1.v.v1 == -0x80) {
    conv_u_1.v.v1 = 0x7f;
    (env->vfp).qc[0] = 1;
  }
  else {
    conv_u_1.v.v1 = -conv_u_1.v.v1;
  }
  aVar1 = conv_u_1;
  if (conv_u_1.v.v2 == -0x80) {
    conv_u_1.v.v2 = 0x7f;
    (env->vfp).qc[0] = 1;
  }
  else {
    conv_u_1.v.v2 = -conv_u_1.v.v2;
  }
  conv_u_1.v.v3 = aVar1.v.v3;
  conv_u_1.v.v4 = aVar1.v.v4;
  if (conv_u_1.v.v3 == -0x80) {
    conv_u_1.v.v3 = 0x7f;
    (env->vfp).qc[0] = 1;
  }
  else {
    conv_u_1.v.v3 = -conv_u_1.v.v3;
  }
  if (conv_u_1.v.v4 == -0x80) {
    conv_u_1.v.v4 = 0x7f;
    (env->vfp).qc[0] = 1;
  }
  else {
    conv_u_1.v.v4 = -conv_u_1.v.v4;
  }
  return conv_u_1.i;
}

Assistant:

uint32_t HELPER(neon_qneg_s8)(CPUARMState *env, uint32_t x)
{
    neon_s8 vec;
    NEON_UNPACK(neon_s8, vec, x);
    DO_QNEG8(vec.v1);
    DO_QNEG8(vec.v2);
    DO_QNEG8(vec.v3);
    DO_QNEG8(vec.v4);
    NEON_PACK(neon_s8, x, vec);
    return x;
}